

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableSortSpecsSanitize(ImGuiTable *table)

{
  char cVar1;
  ImGuiTableColumn *pIVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  int column_n_1;
  ulong uVar6;
  long lVar7;
  int column_n;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  
  lVar7 = 0x56;
  uVar6 = 0;
  uVar4 = 0;
  for (lVar9 = 0; lVar9 < table->ColumnsCount; lVar9 = lVar9 + 1) {
    pIVar2 = (table->Columns).Data;
    bVar5 = *(byte *)((long)&pIVar2->Flags + lVar7);
    if (bVar5 == 0xff) {
LAB_002083af:
      bVar5 = 0xff;
    }
    else if (*(char *)((long)&pIVar2->WidthGiven + lVar7) == '\0') {
      *(undefined1 *)((long)&pIVar2->Flags + lVar7) = 0xff;
      goto LAB_002083af;
    }
    uVar11 = 1L << (bVar5 & 0x3f);
    if (bVar5 == 0xff) {
      uVar11 = 0;
    }
    uVar6 = uVar6 | uVar11;
    uVar4 = uVar4 + (bVar5 != 0xff);
    lVar7 = lVar7 + 0x68;
  }
  if (uVar4 < 2) {
    bVar12 = false;
  }
  else {
    bVar12 = (table->Flags & 0x4000000) == 0;
  }
  if (1L << ((byte)uVar4 & 0x3f) != uVar6 + 1 || bVar12) {
    uVar6 = 0;
    for (uVar8 = 0; uVar8 < uVar4; uVar8 = uVar8 + 1) {
      uVar3 = table->ColumnsCount;
      if (table->ColumnsCount < 1) {
        uVar3 = 0;
      }
      lVar7 = 0x56;
      uVar10 = 0xffffffff;
      for (uVar11 = 0; uVar3 != uVar11; uVar11 = uVar11 + 1) {
        if ((uVar6 >> (uVar11 & 0x3f) & 1) == 0) {
          pIVar2 = (table->Columns).Data;
          cVar1 = *(char *)((long)&pIVar2->Flags + lVar7);
          if ((cVar1 != -1) && ((uVar10 == 0xffffffff || (cVar1 < pIVar2[(int)uVar10].SortOrder))))
          {
            uVar10 = (uint)uVar11;
          }
        }
        lVar7 = lVar7 + 0x68;
      }
      (table->Columns).Data[(int)uVar10].SortOrder = (ImGuiTableColumnIdx)uVar8;
      if (bVar12) {
        lVar7 = 0x56;
        uVar4 = 1;
        for (uVar6 = 0; (long)uVar6 < (long)table->ColumnsCount; uVar6 = uVar6 + 1) {
          if (uVar10 != uVar6) {
            *(undefined1 *)((long)&((table->Columns).Data)->Flags + lVar7) = 0xff;
          }
          lVar7 = lVar7 + 0x68;
        }
        goto LAB_00208508;
      }
      uVar6 = uVar6 | 1L << ((ulong)uVar10 & 0x3f);
    }
  }
  if ((uVar4 == 0) && (uVar4 = 0, (table->Flags & 0x8000000) == 0)) {
    uVar4 = 0;
    uVar8 = table->ColumnsCount;
    if (table->ColumnsCount < 1) {
      uVar8 = uVar4;
    }
    for (lVar7 = 0; (ulong)uVar8 * 0x68 - lVar7 != 0; lVar7 = lVar7 + 0x68) {
      pIVar2 = (table->Columns).Data;
      if (((&pIVar2->IsEnabled)[lVar7] == true) &&
         ((*(byte *)((long)&pIVar2->Flags + lVar7 + 1) & 2) == 0)) {
        (&pIVar2->SortOrder)[lVar7] = '\0';
        (&pIVar2->field_0x65)[lVar7] =
             (&pIVar2->field_0x65)[lVar7] & 0xfc | (&pIVar2->SortDirectionsAvailList)[lVar7] & 3;
        uVar4 = 1;
        break;
      }
    }
  }
LAB_00208508:
  table->SortSpecsCount = (ImGuiTableColumnIdx)uVar4;
  return;
}

Assistant:

void ImGui::TableSortSpecsSanitize(ImGuiTable* table)
{
    IM_ASSERT(table->Flags & ImGuiTableFlags_Sortable);

    // Clear SortOrder from hidden column and verify that there's no gap or duplicate.
    int sort_order_count = 0;
    ImU64 sort_order_mask = 0x00;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->SortOrder != -1 && !column->IsEnabled)
            column->SortOrder = -1;
        if (column->SortOrder == -1)
            continue;
        sort_order_count++;
        sort_order_mask |= ((ImU64)1 << column->SortOrder);
        IM_ASSERT(sort_order_count < (int)sizeof(sort_order_mask) * 8);
    }

    const bool need_fix_linearize = ((ImU64)1 << sort_order_count) != (sort_order_mask + 1);
    const bool need_fix_single_sort_order = (sort_order_count > 1) && !(table->Flags & ImGuiTableFlags_SortMulti);
    if (need_fix_linearize || need_fix_single_sort_order)
    {
        ImU64 fixed_mask = 0x00;
        for (int sort_n = 0; sort_n < sort_order_count; sort_n++)
        {
            // Fix: Rewrite sort order fields if needed so they have no gap or duplicate.
            // (e.g. SortOrder 0 disappeared, SortOrder 1..2 exists --> rewrite then as SortOrder 0..1)
            int column_with_smallest_sort_order = -1;
            for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                if ((fixed_mask & ((ImU64)1 << (ImU64)column_n)) == 0 && table->Columns[column_n].SortOrder != -1)
                    if (column_with_smallest_sort_order == -1 || table->Columns[column_n].SortOrder < table->Columns[column_with_smallest_sort_order].SortOrder)
                        column_with_smallest_sort_order = column_n;
            IM_ASSERT(column_with_smallest_sort_order != -1);
            fixed_mask |= ((ImU64)1 << column_with_smallest_sort_order);
            table->Columns[column_with_smallest_sort_order].SortOrder = (ImGuiTableColumnIdx)sort_n;

            // Fix: Make sure only one column has a SortOrder if ImGuiTableFlags_MultiSortable is not set.
            if (need_fix_single_sort_order)
            {
                sort_order_count = 1;
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                    if (column_n != column_with_smallest_sort_order)
                        table->Columns[column_n].SortOrder = -1;
                break;
            }
        }
    }

    // Fallback default sort order (if no column had the ImGuiTableColumnFlags_DefaultSort flag)
    if (sort_order_count == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if (column->IsEnabled && !(column->Flags & ImGuiTableColumnFlags_NoSort))
            {
                sort_order_count = 1;
                column->SortOrder = 0;
                column->SortDirection = (ImU8)TableGetColumnAvailSortDirection(column, 0);
                break;
            }
        }

    table->SortSpecsCount = (ImGuiTableColumnIdx)sort_order_count;
}